

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QWidget_*> * __thiscall
QList<QWidget_*>::operator+=(QList<QWidget_*> *this,QList<QWidget_*> *l)

{
  long n;
  Data *pDVar1;
  QWidget **ppQVar2;
  
  n = (l->d).size;
  if (n != 0) {
    pDVar1 = (l->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      ppQVar2 = (l->d).ptr;
      QtPrivate::QCommonArrayOps<QWidget_*>::growAppend
                ((QCommonArrayOps<QWidget_*> *)this,ppQVar2,ppQVar2 + n);
    }
    else {
      QArrayDataPointer<QWidget_*>::detachAndGrow
                (&this->d,GrowsAtEnd,n,(QWidget ***)0x0,(QArrayDataPointer<QWidget_*> *)0x0);
      ppQVar2 = (l->d).ptr;
      QtPrivate::QPodArrayOps<QWidget_*>::copyAppend
                ((QPodArrayOps<QWidget_*> *)this,ppQVar2,ppQVar2 + (l->d).size);
    }
  }
  return this;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }